

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void analyze_C_declarations(void *userdata,char *key,int keylen,void *val)

{
  int iVar1;
  C_VarScope *vc;
  C_Type *ty;
  C_Decl_Analysis *analysis;
  void *val_local;
  int keylen_local;
  char *key_local;
  void *userdata_local;
  
  iVar1 = is_builtin(key,keylen);
  if (iVar1 == 0) {
    if (*(int *)((long)userdata + 0x14) == 0) {
      analyze_C_vars((C_Decl_Analysis *)userdata,(C_VarScope *)val);
    }
    else {
      analyze_C_types((C_Decl_Analysis *)userdata,(C_Type *)val);
    }
  }
  return;
}

Assistant:

static void analyze_C_declarations(void *userdata, char *key, int keylen, void *val)
{
	C_Decl_Analysis *analysis = (C_Decl_Analysis *)userdata;
	if (is_builtin(key, keylen))
		return;
	if (analysis->is_tags) {
		C_Type *ty = val;
		analyze_C_types(analysis, ty);
	} else {
		C_VarScope *vc = val;
		analyze_C_vars(analysis, vc);
	}
}